

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O3

double __thiscall CEDate::GetTime(CEDate *this,double *utc_offset)

{
  double __x;
  double dVar1;
  double local_18;
  double local_10;
  
  (*this->_vptr_CEDate[5])();
  dVar1 = floor(__x);
  local_10 = *utc_offset / 24.0 + (__x - dVar1);
  local_18 = CETime::UTC(&local_10);
  dVar1 = CETime::TimeSec2Time(&local_18);
  return dVar1;
}

Assistant:

double CEDate::GetTime(const double& utc_offset) const
{
    double mjd_offset = MJD();
    mjd_offset -= std::floor(mjd_offset);
    mjd_offset += utc_offset/24.0;
    return CETime::TimeSec2Time( CETime::UTC( mjd_offset ) ) ;
}